

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_utf.c
# Opt level: O1

uint fl_utf8froma(char *dst,uint dstlen,char *src,uint srclen)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  byte *pbVar4;
  ulong in_R9;
  char cVar5;
  byte bVar6;
  
  pbVar4 = (byte *)(src + srclen);
  if (dstlen == 0) {
    uVar3 = 0;
  }
  else {
    uVar3 = 0;
    do {
      iVar1 = (int)uVar3;
      if (src < pbVar4) {
        bVar6 = *src;
        src = (char *)((byte *)src + 1);
        if ((char)bVar6 < '\0') {
          if (iVar1 + 2U < dstlen) {
            dst[uVar3] = bVar6 >> 6 | 0xc0;
            dst[iVar1 + 1] = bVar6 & 0xbf;
            cVar5 = '\0';
          }
          else {
            dst[uVar3] = '\0';
            cVar5 = '\x02';
          }
          uVar3 = (ulong)(iVar1 + 2U);
        }
        else {
          uVar2 = iVar1 + 1;
          if (dstlen <= uVar2) {
            bVar6 = 0;
          }
          dst[uVar3] = bVar6;
          cVar5 = (dstlen <= uVar2) * '\x02';
          uVar3 = (ulong)uVar2;
        }
      }
      else {
        dst[uVar3] = '\0';
        cVar5 = '\x01';
        in_R9 = uVar3;
      }
    } while (cVar5 == '\0');
    if (cVar5 != '\x02') {
      return (uint)in_R9;
    }
  }
  for (; src < pbVar4; src = (char *)((byte *)src + 1)) {
    uVar3 = (ulong)((uint)uVar3 + (uint)((byte)*src >> 7) + 1);
  }
  return (uint)uVar3;
}

Assistant:

unsigned fl_utf8froma(char* dst, unsigned dstlen,
		   const char* src, unsigned srclen) {
  const char* p = src;
  const char* e = src+srclen;
  unsigned count = 0;
  if (dstlen) for (;;) {
    unsigned char ucs;
    if (p >= e) {dst[count] = 0; return count;}
    ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      dst[count++] = ucs;
      if (count >= dstlen) {dst[count-1] = 0; break;}
    } else { /* 2 bytes (note that CP1252 translate could make 3 bytes!) */
      if (count+2 >= dstlen) {dst[count] = 0; count += 2; break;}
      dst[count++] = 0xc0 | (ucs >> 6);
      dst[count++] = 0x80 | (ucs & 0x3F);
    }
  }
  /* we filled dst, measure the rest: */
  while (p < e) {
    unsigned char ucs = *(const unsigned char*)p++;
    if (ucs < 0x80U) {
      count++;
    } else {
      count += 2;
    }
  }
  return count;
}